

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void flatbuffers::SetAnyValueI(BaseType type,uint8_t *data,int64_t val)

{
  int64_t val_local;
  uint8_t *data_local;
  BaseType type_local;
  
  switch(type) {
  case UType:
  case Bool:
  case UByte:
    WriteScalar<unsigned_char>(data,(uchar)val);
    break;
  case Byte:
    WriteScalar<signed_char>(data,(uchar)val);
    break;
  case Short:
    WriteScalar<short>(data,(unsigned_short)val);
    break;
  case UShort:
    WriteScalar<unsigned_short>(data,(unsigned_short)val);
    break;
  case Int:
    WriteScalar<int>(data,(uint)val);
    break;
  case UInt:
    WriteScalar<unsigned_int>(data,(uint)val);
    break;
  case Long:
    WriteScalar<long>(data,val);
    break;
  case ULong:
    WriteScalar<unsigned_long>(data,val);
    break;
  case Float:
    WriteScalar<float>(data,(float)val);
    break;
  case Double:
    WriteScalar<double>(data,(double)val);
  }
  return;
}

Assistant:

void SetAnyValueI(reflection::BaseType type, uint8_t *data, int64_t val) {
  // clang-format off
  #define FLATBUFFERS_SET(T) WriteScalar(data, static_cast<T>(val))
  switch (type) {
    case reflection::UType:
    case reflection::Bool:
    case reflection::UByte:  FLATBUFFERS_SET(uint8_t ); break;
    case reflection::Byte:   FLATBUFFERS_SET(int8_t  ); break;
    case reflection::Short:  FLATBUFFERS_SET(int16_t ); break;
    case reflection::UShort: FLATBUFFERS_SET(uint16_t); break;
    case reflection::Int:    FLATBUFFERS_SET(int32_t ); break;
    case reflection::UInt:   FLATBUFFERS_SET(uint32_t); break;
    case reflection::Long:   FLATBUFFERS_SET(int64_t ); break;
    case reflection::ULong:  FLATBUFFERS_SET(uint64_t); break;
    case reflection::Float:  FLATBUFFERS_SET(float   ); break;
    case reflection::Double: FLATBUFFERS_SET(double  ); break;
    // TODO: support strings
    default: break;
  }
  #undef FLATBUFFERS_SET
  // clang-format on
}